

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

void glfwSetCursor(GLFWwindow *windowHandle,GLFWcursor *cursorHandle)

{
  _GLFWcursor *cursor;
  _GLFWwindow *window;
  GLFWcursor *cursorHandle_local;
  GLFWwindow *windowHandle_local;
  
  if (windowHandle != (GLFWwindow *)0x0) {
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
    }
    else {
      *(GLFWcursor **)(windowHandle + 0x48) = cursorHandle;
      _glfwPlatformSetCursor((_GLFWwindow *)windowHandle,(_GLFWcursor *)cursorHandle);
    }
    return;
  }
  __assert_fail("window != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/glfw/src/input.c"
                ,0x338,"void glfwSetCursor(GLFWwindow *, GLFWcursor *)");
}

Assistant:

GLFWAPI void glfwSetCursor(GLFWwindow* windowHandle, GLFWcursor* cursorHandle)
{
    _GLFWwindow* window = (_GLFWwindow*) windowHandle;
    _GLFWcursor* cursor = (_GLFWcursor*) cursorHandle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    window->cursor = cursor;

    _glfwPlatformSetCursor(window, cursor);
}